

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_align.c
# Opt level: O2

int main(int32 argc,char **argv)

{
  mdef_t *pmVar1;
  mgau_model_t *g;
  ms_mgau_model_t *msg;
  kbcore_t *kbc;
  adapt_am_t *ad;
  cmn_type_t cmn;
  agc_type_t agc;
  int iVar2;
  cmd_ln_t *cmdln;
  long lVar3;
  char *pcVar4;
  logmath_t *plVar5;
  char *pcVar6;
  long lVar7;
  feat_t *pfVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  double dVar14;
  double cipbeam;
  double dVar15;
  ptmr_t local_4070;
  char sent [16384];
  
  cmd_ln_appl_enter(argc,argv,"default.arg",defn);
  cmdln = cmd_ln_get();
  lVar3 = cmd_ln_int_r(cmdln,"-ctloffset");
  ctloffset = (int32)lVar3;
  sentfile = cmd_ln_str_r(cmdln,"-insent");
  sentfp = (FILE *)fopen(sentfile,"r");
  if ((FILE *)sentfp == (FILE *)0x0) {
    pcVar6 = "Failed to open file %s for reading";
    lVar3 = 0x3aa;
    pcVar4 = sentfile;
LAB_0011218a:
    err_msg_system(ERR_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                   ,lVar3,pcVar6,pcVar4);
    goto LAB_001121b0;
  }
  pcVar4 = cmd_ln_str_r(cmdln,"-s2stsegdir");
  if (pcVar4 != (char *)0x0) {
    pcVar4 = cmd_ln_str_r(cmdln,"-s2stsegdir");
    s2stsegdir = __ckd_salloc__(pcVar4,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                                ,0x3ae);
  }
  pcVar4 = cmd_ln_str_r(cmdln,"-stsegdir");
  if (pcVar4 != (char *)0x0) {
    pcVar4 = cmd_ln_str_r(cmdln,"-stsegdir");
    stsegdir = __ckd_salloc__(pcVar4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                              ,0x3b0);
  }
  pcVar4 = cmd_ln_str_r(cmdln,"-phsegdir");
  if (pcVar4 != (char *)0x0) {
    pcVar4 = cmd_ln_str_r(cmdln,"-phsegdir");
    phsegdir = __ckd_salloc__(pcVar4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                              ,0x3b2);
  }
  pcVar4 = cmd_ln_str_r(cmdln,"-phlabdir");
  if (pcVar4 != (char *)0x0) {
    pcVar4 = cmd_ln_str_r(cmdln,"-phlabdir");
    phlabdir = __ckd_salloc__(pcVar4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                              ,0x3b4);
  }
  pcVar4 = cmd_ln_str_r(cmdln,"-wdsegdir");
  if (pcVar4 != (char *)0x0) {
    pcVar4 = cmd_ln_str_r(cmdln,"-wdsegdir");
    wdsegdir = __ckd_salloc__(pcVar4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                              ,0x3b6);
  }
  for (; 0 < ctloffset; ctloffset = ctloffset + -1) {
    pcVar4 = fgets(sent,0x4000,(FILE *)sentfp);
    if (pcVar4 == (char *)0x0) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
              ,0x3c4,"EOF(%s)\n",sentfile);
      break;
    }
  }
  outsentfile = cmd_ln_str_r(cmdln,"-outsent");
  if (outsentfile != (char *)0x0) {
    outsentfp = (FILE *)fopen(outsentfile,"w");
    if ((FILE *)outsentfp == (FILE *)0x0) {
      pcVar6 = "Failed to open file %s for writing";
      lVar3 = 0x3cc;
      pcVar4 = outsentfile;
      goto LAB_0011218a;
    }
  }
  outctlfile = cmd_ln_str_r(cmdln,"-outctl");
  if (outctlfile != (char *)0x0) {
    outctlfp = (FILE *)fopen(outctlfile,"w");
    if ((FILE *)outctlfp == (FILE *)0x0) {
      pcVar6 = "Failed top open file %s for writing";
      lVar3 = 0x3d1;
      pcVar4 = outctlfile;
      goto LAB_0011218a;
    }
  }
  pcVar4 = cmd_ln_str_r(cmdln,"-s2stsegdir");
  if (pcVar4 == (char *)0x0) {
    pcVar4 = cmd_ln_str_r(cmdln,"-stsegdir");
    if (pcVar4 != (char *)0x0) goto LAB_00111a9c;
    pcVar4 = cmd_ln_str_r(cmdln,"-phlabdir");
    if (pcVar4 != (char *)0x0) goto LAB_00111a9c;
    pcVar4 = cmd_ln_str_r(cmdln,"-phsegdir");
    if (pcVar4 != (char *)0x0) goto LAB_00111a9c;
    pcVar4 = cmd_ln_str_r(cmdln,"-wdsegdir");
    if (pcVar4 != (char *)0x0) goto LAB_00111a9c;
    pcVar4 = cmd_ln_str_r(cmdln,"-outsent");
    if (pcVar4 != (char *)0x0) goto LAB_00111a9c;
    pcVar4 = "Missing output file/directory argument(s)\n";
    lVar3 = 0x3da;
  }
  else {
LAB_00111a9c:
    ::kbc = New_kbcore(cmdln);
    dVar14 = cmd_ln_float_r(cmdln,"-logbase");
    lVar3 = cmd_ln_int_r(cmdln,"-log3table");
    plVar5 = logs3_init((float64)dVar14,1,(int32)lVar3);
    ::kbc->logmath = plVar5;
    pcVar4 = cmd_ln_str_r(cmdln,"-feat");
    pcVar6 = cmd_ln_str_r(cmdln,"-cmn");
    cmn = cmn_type_from_str(pcVar6);
    lVar3 = cmd_ln_int_r(cmdln,"-varnorm");
    pcVar6 = cmd_ln_str_r(cmdln,"-agc");
    agc = agc_type_from_str(pcVar6);
    lVar7 = cmd_ln_int_r(cmdln,"-ceplen");
    pfVar8 = feat_init(pcVar4,cmn,(uint)(lVar3 != 0),agc,1,(int32)lVar7);
    kbc = ::kbc;
    ::kbc->fcb = pfVar8;
    s3_am_init(kbc);
    iVar2 = cmd_ln_exists_r(cmdln,"-adcin");
    if (iVar2 != 0) {
      lVar3 = cmd_ln_int_r(cmdln,"-adcin");
      if (lVar3 != 0) {
        fe = fe_init_auto_r(cmdln);
        if (fe == (fe_t *)0x0) {
          pcVar4 = "fe_init_auto_r() failed\n";
          lVar3 = 0xd7;
          goto LAB_001121a9;
        }
      }
    }
    if (::kbc == (kbcore_t *)0x0) {
      __assert_fail("kbc",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                    ,0xdb,"void models_init(cmd_ln_t *)");
    }
    pmVar1 = ::kbc->mdef;
    if (pmVar1 == (mdef_t *)0x0) {
      __assert_fail("kbc->mdef",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                    ,0xdc,"void models_init(cmd_ln_t *)");
    }
    if (::kbc->tmat == (tmat_t *)0x0) {
      __assert_fail("kbc->tmat",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                    ,0xdd,"void models_init(cmd_ln_t *)");
    }
    pcVar4 = cmd_ln_str_r(cmdln,"-dict");
    pcVar6 = cmd_ln_str_r(cmdln,"-fdict");
    lVar3 = cmd_ln_int_r(cmdln,"-lts_mismatch");
    lVar7 = cmd_ln_int_r(cmdln,"-mdef_fillers");
    dict = dict_init(pmVar1,pcVar4,pcVar6,(int)lVar3,(uint)(lVar7 != 0),0,1);
    pmVar1 = ::kbc->mdef;
    uVar13 = 0xffffffffffffffff;
    do {
      lVar3 = uVar13 + 1;
      uVar13 = uVar13 + 1;
    } while (uVar13 == (uint)(int)pmVar1->cd2cisen[lVar3]);
    ascr = ascr_init(pmVar1->n_sen,0,pmVar1->n_sseq,0,1,(int32)uVar13);
    lVar3 = cmd_ln_int_r(cmdln,"-ds");
    lVar7 = cmd_ln_int_r(cmdln,"-cond_ds");
    lVar9 = cmd_ln_int_r(cmdln,"-dist_ds");
    lVar10 = cmd_ln_int_r(cmdln,"-gs4gs");
    lVar11 = cmd_ln_int_r(cmdln,"-svq4svq");
    dVar14 = cmd_ln_float_r(cmdln,"-subvqbeam");
    cipbeam = cmd_ln_float_r(cmdln,"-ci_pbeam");
    dVar15 = cmd_ln_float_r(cmdln,"-tighten_factor");
    lVar12 = cmd_ln_int_r(cmdln,"-maxcdsenpf");
    fastgmm = fast_gmm_init((int32)lVar3,(int32)lVar7,(int32)lVar9,(int32)lVar10,(int32)lVar11,
                            (float64)dVar14,(float64)cipbeam,(float32)(float)dVar15,(int32)lVar12,
                            ::kbc->mdef->n_ci_sen,::kbc->logmath);
    adapt_am = adapt_am_init();
    if (feat == (float32 ***)0x0) {
      feat = feat_array_alloc(::kbc->fcb,15000);
    }
    timers[0].name = "U";
    timers[1].name = "G";
    timers[2].name = "S";
    timers[3].name = "A";
    align_init(::kbc->mdef,::kbc->tmat,dict,cmdln,::kbc->logmath);
    putchar(10);
    pcVar4 = cmd_ln_str_r(cmdln,"-mllr");
    ad = adapt_am;
    if (pcVar4 != (char *)0x0) {
      g = ::kbc->mgau;
      if (g == (mgau_model_t *)0x0) {
        msg = ::kbc->ms_mgau;
        if (msg == (ms_mgau_model_t *)0x0) {
          err_msg(ERR_WARN,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                  ,0x3f3,"Can\'t use MLLR matrices with .s2semi. yet\n");
        }
        else {
          pcVar4 = cmd_ln_str_r(cmdln,"-mllr");
          model_set_mllr(msg,pcVar4,(char *)0x0,::kbc->fcb,::kbc->mdef,cmdln);
        }
      }
      else {
        pcVar4 = cmd_ln_str_r(cmdln,"-mllr");
        adapt_set_mllr(ad,g,pcVar4,(char *)0x0,::kbc->mdef,cmdln);
      }
    }
    tot_nfr = 0;
    pcVar4 = cmd_ln_str_r(cmdln,"-ctl");
    if (pcVar4 != (char *)0x0) {
      pcVar4 = cmd_ln_str_r(cmdln,"-ctl");
      pcVar6 = cmd_ln_str_r(cmdln,"-ctl_mllr");
      lVar3 = cmd_ln_int_r(cmdln,"-ctloffset");
      lVar7 = cmd_ln_int_r(cmdln,"-ctlcount");
      ctl_process(&local_4070,pcVar4,(char *)0x0,pcVar6,(int32)lVar3,(int32)lVar7,utt_align,cmdln);
      if (0 < tot_nfr) {
        putchar(10);
        printf("TOTAL FRAMES:       %8d\n",(ulong)(uint)tot_nfr);
        printf("TOTAL CPU TIME:     %11.2f sec, %7.2f xRT\n",tm_utt.t_tot_cpu,
               (double)tm_utt.t_tot_cpu / ((double)tot_nfr * 0.01));
        printf("TOTAL ELAPSED TIME: %11.2f sec, %7.2f xRT\n",tm_utt.t_tot_elapsed,
               (double)tm_utt.t_tot_elapsed / ((double)tot_nfr * 0.01));
      }
      if (outsentfp != (FILE *)0x0) {
        fclose((FILE *)outsentfp);
      }
      if (outctlfp != (FILE *)0x0) {
        fclose((FILE *)outctlfp);
      }
      if (sentfp != (FILE *)0x0) {
        fclose((FILE *)sentfp);
      }
      ckd_free(s2stsegdir);
      ckd_free(stsegdir);
      ckd_free(phsegdir);
      ckd_free(wdsegdir);
      feat_array_free(feat);
      align_free();
      if (adapt_am != (adapt_am_t *)0x0) {
        adapt_am_free(adapt_am);
      }
      if (fastgmm != (fast_gmm_t *)0x0) {
        fast_gmm_free(fastgmm);
      }
      if (ascr != (ascr_t *)0x0) {
        ascr_free(ascr);
      }
      if (dict != (dict_t *)0x0) {
        dict_free(dict);
      }
      kbcore_free(::kbc);
      cmd_ln_free_r(cmdln);
      return 0;
    }
    pcVar4 = " -ctl are not specified.\n";
    lVar3 = 0x405;
  }
LAB_001121a9:
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
          ,lVar3,pcVar4);
LAB_001121b0:
  exit(1);
}

Assistant:

int
main(int32 argc, char *argv[])
{
    char sent[16384];
    cmd_ln_t *config;

    cmd_ln_appl_enter(argc, argv, "default.arg", defn);

    config = cmd_ln_get();

    ctloffset = cmd_ln_int32_r(config, "-ctloffset");
    sentfile = cmd_ln_str_r(config, "-insent");

    if ((sentfp = fopen(sentfile, "r")) == NULL)
        E_FATAL_SYSTEM("Failed to open file %s for reading", sentfile);

    /* Note various output directories */
    if (cmd_ln_str_r(config, "-s2stsegdir") != NULL)
        s2stsegdir = (char *) ckd_salloc(cmd_ln_str_r(config, "-s2stsegdir"));
    if (cmd_ln_str_r(config, "-stsegdir") != NULL)
        stsegdir = (char *) ckd_salloc(cmd_ln_str_r(config, "-stsegdir"));
    if (cmd_ln_str_r(config, "-phsegdir") != NULL)
        phsegdir = (char *) ckd_salloc(cmd_ln_str_r(config, "-phsegdir"));
    if (cmd_ln_str_r(config, "-phlabdir") != NULL)
        phlabdir = (char *) ckd_salloc(cmd_ln_str_r(config, "-phlabdir"));
    if (cmd_ln_str_r(config, "-wdsegdir") != NULL)
        wdsegdir = (char *) ckd_salloc(cmd_ln_str_r(config, "-wdsegdir"));

    /* HACK! Pre-read insent without checking whether ctl could also 
       be read.  In general, this is caused by the fact that we used
       multiple files to specify resource in sphinx III.  This is easy
       to solve but currently I just to remove process_ctl because it
       duplicates badly with ctl_process.  

       The call back function will take care of matching the uttfile
       names. We don't need to worry too much about inconsistency. 
     */

    while (ctloffset > 0) {
        if (fgets(sent, sizeof(sent), sentfp) == NULL) {
            E_ERROR("EOF(%s)\n", sentfile);
            break;
        }
        --ctloffset;
    }

    if ((outsentfile = cmd_ln_str_r(config, "-outsent")) != NULL) {
        if ((outsentfp = fopen(outsentfile, "w")) == NULL)
            E_FATAL_SYSTEM("Failed to open file %s for writing", outsentfile);
    }

    if ((outctlfile = cmd_ln_str_r(config, "-outctl")) != NULL) {
        if ((outctlfp = fopen(outctlfile, "w")) == NULL)
            E_FATAL_SYSTEM("Failed top open file %s for writing", outctlfile);
    }

    if ((cmd_ln_str_r(config, "-s2stsegdir") == NULL) &&
        (cmd_ln_str_r(config, "-stsegdir") == NULL) &&
        (cmd_ln_str_r(config, "-phlabdir") == NULL) &&
        (cmd_ln_str_r(config, "-phsegdir") == NULL) &&
        (cmd_ln_str_r(config, "-wdsegdir") == NULL) &&
        (cmd_ln_str_r(config, "-outsent") == NULL))
        E_FATAL("Missing output file/directory argument(s)\n");

    /* Read in input databases */
    models_init(config);

    if (!feat)
        feat = feat_array_alloc(kbcore_fcb(kbc), S3_MAX_FRAMES);

    timers[tmr_utt].name = "U";
    timers[tmr_gauden].name = "G";
    timers[tmr_senone].name = "S";
    timers[tmr_align].name = "A";

    /* Initialize align module */
    align_init(kbc->mdef, kbc->tmat, dict, config, kbc->logmath);
    printf("\n");

    if (cmd_ln_str_r(config, "-mllr") != NULL) {
        if (kbc->mgau)
            adapt_set_mllr(adapt_am, kbc->mgau, cmd_ln_str_r(config, "-mllr"), NULL,
                           kbc->mdef, config);
        else if (kbc->ms_mgau)
            model_set_mllr(kbc->ms_mgau, cmd_ln_str_r(config, "-mllr"), NULL, kbcore_fcb(kbc),
                           kbc->mdef, config);
        else
            E_WARN("Can't use MLLR matrices with .s2semi. yet\n");
    }

    tot_nfr = 0;

    /*  process_ctlfile (); */

    if (cmd_ln_str_r(config, "-ctl")) {
        /* When -ctlfile is speicified, corpus.c will look at -ctl_mllr to get
           the corresponding  MLLR for the utterance */
        ctl_process(cmd_ln_str_r(config, "-ctl"),
                    NULL,
                    cmd_ln_str_r(config, "-ctl_mllr"),
                    cmd_ln_int32_r(config, "-ctloffset"),
                    cmd_ln_int32_r(config, "-ctlcount"),
                    utt_align, config);
    }
    else {
        E_FATAL(" -ctl are not specified.\n");
    }

    if (tot_nfr > 0) {
        printf("\n");
        printf("TOTAL FRAMES:       %8d\n", tot_nfr);
        printf("TOTAL CPU TIME:     %11.2f sec, %7.2f xRT\n",
               tm_utt.t_tot_cpu, tm_utt.t_tot_cpu / (tot_nfr * 0.01));
        printf("TOTAL ELAPSED TIME: %11.2f sec, %7.2f xRT\n",
               tm_utt.t_tot_elapsed,
               tm_utt.t_tot_elapsed / (tot_nfr * 0.01));
    }

    if (outsentfp)
        fclose(outsentfp);
    if (outctlfp)
        fclose(outctlfp);
    if (sentfp)
        fclose(sentfp);

    ckd_free(s2stsegdir);
    ckd_free(stsegdir);
    ckd_free(phsegdir);
    ckd_free(wdsegdir);

    feat_array_free(feat);
    align_free();
    models_free();

    cmd_ln_free_r(config);
    return 0;
}